

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# family.cc
# Opt level: O3

void __thiscall
prometheus::Family<prometheus::Histogram>::Remove
          (Family<prometheus::Histogram> *this,Histogram *metric)

{
  mutex *__mutex;
  int iVar1;
  undefined8 uVar2;
  _Node_iterator_base<std::pair<const_std::map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>,_std::unique_ptr<prometheus::Histogram,_std::default_delete<prometheus::Histogram>_>_>,_true>
  __it;
  
  __mutex = &this->mutex_;
  iVar1 = pthread_mutex_lock((pthread_mutex_t *)__mutex);
  if (iVar1 != 0) {
    uVar2 = std::__throw_system_error(iVar1);
    pthread_mutex_unlock((pthread_mutex_t *)__mutex);
    _Unwind_Resume(uVar2);
  }
  __it._M_cur = (__node_type *)&(this->metrics_)._M_h._M_before_begin;
  do {
    __it._M_cur = (__node_type *)((__it._M_cur)->super__Hash_node_base)._M_nxt;
    if (__it._M_cur == (__node_type *)0x0) goto LAB_00142f10;
  } while (*(Histogram **)((long)__it._M_cur + 0x38) != metric);
  std::_Hashtable<$21cb3630$>::erase(&(this->metrics_)._M_h,(const_iterator)__it._M_cur);
LAB_00142f10:
  pthread_mutex_unlock((pthread_mutex_t *)__mutex);
  return;
}

Assistant:

void Family<T>::Remove(T* metric) {
  std::lock_guard<std::mutex> lock{mutex_};

  for (auto it = metrics_.begin(); it != metrics_.end(); ++it) {
    if (it->second.get() == metric) {
      metrics_.erase(it);
      break;
    }
  }
}